

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edithdu.c
# Opt level: O0

int ffibin(fitsfile *fptr,LONGLONG naxis2,int tfields,char **ttype,char **tform,char **tunit,
          char *extnmx,LONGLONG pcount,int *status)

{
  undefined8 uVar1;
  int *piVar2;
  uint in_EDX;
  long in_RSI;
  int *in_RDI;
  fitsfile *in_R9;
  char *in_stack_00000008;
  int *in_stack_00000018;
  char extnm [71];
  char **in_stack_00000068;
  char errmsg [81];
  LONGLONG newstart;
  LONGLONG datasize;
  long width;
  long repeat;
  long nblocks;
  LONGLONG naxis1;
  int datacode;
  int nhead;
  int nunit;
  int ii;
  int maxhdu;
  int nexthdu;
  int *in_stack_00000a20;
  fitsfile *in_stack_00000a28;
  int *in_stack_000015e0;
  int in_stack_000015ec;
  long in_stack_000015f0;
  fitsfile *in_stack_000015f8;
  char local_128 [16];
  char **in_stack_fffffffffffffee8;
  char **in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffefc;
  LONGLONG in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff0c;
  fitsfile *in_stack_ffffffffffffff10;
  int *in_stack_ffffffffffffff20;
  int *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  fitsfile *in_stack_ffffffffffffff38;
  int *in_stack_ffffffffffffff40;
  long local_70;
  int *in_stack_ffffffffffffff98;
  long *in_stack_ffffffffffffffa0;
  long *trepeat;
  int in_stack_ffffffffffffffb0;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 in_stack_ffffffffffffffc4;
  int local_4;
  
  if (*in_stack_00000018 < 1) {
    local_128[0] = '\0';
    if (in_stack_00000008 != (char *)0x0) {
      strncat(local_128,in_stack_00000008,0x46);
    }
    if (*in_RDI != *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      ffmahd(in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,in_stack_ffffffffffffff28,
             in_stack_ffffffffffffff20);
    }
    iVar6 = *(int *)(*(long *)(in_RDI + 2) + 0x60);
    if ((*(long *)(*(long *)(in_RDI + 2) + 0x70) ==
         *(long *)(*(long *)(*(long *)(in_RDI + 2) + 0x68) +
                  (long)*(int *)(*(long *)(in_RDI + 2) + 0x54) * 8)) ||
       ((*(int *)(*(long *)(in_RDI + 2) + 0x54) == iVar6 &&
        (*(long *)(*(long *)(in_RDI + 2) + 0x30) <=
         *(long *)(*(long *)(*(long *)(in_RDI + 2) + 0x68) + (long)(iVar6 + 1) * 8))))) {
      ffcrtb(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff00,
             in_stack_fffffffffffffefc,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             (char **)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             (char *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff40);
      local_4 = *in_stack_00000018;
    }
    else if (in_RSI < 0) {
      *in_stack_00000018 = 0xda;
      local_4 = 0xda;
    }
    else if (((int)in_EDX < 0) || (999 < (int)in_EDX)) {
      snprintf(&stack0xffffffffffffff28,0x51,"Illegal value for TFIELDS keyword: %d",(ulong)in_EDX);
      ffpmsg((char *)0x138aa7);
      *in_stack_00000018 = 0xd8;
      local_4 = 0xd8;
    }
    else {
      iVar3 = 0;
      for (iVar4 = 0; iVar4 < (int)in_EDX; iVar4 = iVar4 + 1) {
        if (((in_R9 != (fitsfile *)0x0) && (*(long *)in_R9 != 0)) &&
           (**(char **)(&in_R9->HDUposition + (long)iVar4 * 2) != '\0')) {
          iVar3 = iVar3 + 1;
        }
      }
      if (local_128[0] != '\0') {
        iVar3 = iVar3 + 1;
      }
      iVar4 = (int)(in_EDX * 2 + iVar3 + 0x2c) / 0x24;
      trepeat = (long *)0x0;
      for (iVar5 = 0; iVar5 < (int)in_EDX; iVar5 = iVar5 + 1) {
        ffbnfm((char *)CONCAT44(iVar5,iVar3),(int *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),
               trepeat,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        if (in_stack_ffffffffffffffb0 == 1) {
          piVar2 = (int *)(((long)in_stack_ffffffffffffff98 + 7) / 8);
        }
        else {
          piVar2 = in_stack_ffffffffffffff98;
          if (in_stack_ffffffffffffffb0 != 0x10) {
            piVar2 = (int *)((long)in_stack_ffffffffffffff98 * local_70);
          }
        }
        trepeat = (long *)((long)trepeat + (long)piVar2);
      }
      if (*(int *)(*(long *)(in_RDI + 2) + 0x5c) == 1) {
        ffrdef(in_R9,(int *)CONCAT44(in_stack_ffffffffffffffc4,iVar6));
        ffpdfl(in_stack_00000a28,in_stack_00000a20);
        iVar3 = *(int *)(*(long *)(in_RDI + 2) + 0x54) + 1;
        uVar1 = *(undefined8 *)(*(long *)(*(long *)(in_RDI + 2) + 0x68) + (long)iVar3 * 8);
        *(undefined4 *)(*(long *)(in_RDI + 2) + 0x58) = 2;
        iVar5 = ffiblk(in_stack_000015f8,in_stack_000015f0,in_stack_000015ec,in_stack_000015e0);
        if (iVar5 < 1) {
          *(int *)(*(long *)(in_RDI + 2) + 0x60) = *(int *)(*(long *)(in_RDI + 2) + 0x60) + 1;
          for (iVar5 = *(int *)(*(long *)(in_RDI + 2) + 0x60);
              *(int *)(*(long *)(in_RDI + 2) + 0x54) < iVar5; iVar5 = iVar5 + -1) {
            *(undefined8 *)(*(long *)(*(long *)(in_RDI + 2) + 0x68) + (long)(iVar5 + 1) * 8) =
                 *(undefined8 *)(*(long *)(*(long *)(in_RDI + 2) + 0x68) + (long)iVar5 * 8);
          }
          *(undefined8 *)(*(long *)(*(long *)(in_RDI + 2) + 0x68) + (long)iVar3 * 8) = uVar1;
          *(int *)(*(long *)(in_RDI + 2) + 0x54) = iVar3;
          *in_RDI = iVar3;
          *(undefined8 *)(*(long *)(in_RDI + 2) + 0x80) =
               *(undefined8 *)(*(long *)(*(long *)(in_RDI + 2) + 0x68) + (long)iVar3 * 8);
          *(undefined8 *)(*(long *)(in_RDI + 2) + 0x70) =
               *(undefined8 *)(*(long *)(*(long *)(in_RDI + 2) + 0x68) + (long)iVar3 * 8);
          *(long *)(*(long *)(in_RDI + 2) + 0x88) =
               *(long *)(*(long *)(*(long *)(in_RDI + 2) + 0x68) + (long)iVar3 * 8) +
               (long)(iVar4 * 0xb40);
          *(undefined4 *)(*(long *)(in_RDI + 2) + 0x58) = 2;
          ffphbn((fitsfile *)errmsg._24_8_,errmsg._16_8_,errmsg._12_4_,(char **)errmsg._0_8_,
                 in_stack_00000068,stack0x00000060,(char *)errmsg._48_8_,errmsg._56_8_,
                 (int *)errmsg._64_8_);
          ffrdef(in_R9,(int *)CONCAT44(iVar3,iVar6));
          local_4 = *in_stack_00000018;
        }
        else {
          local_4 = *in_stack_00000018;
        }
      }
      else {
        *in_stack_00000018 = 0x70;
        local_4 = 0x70;
      }
    }
  }
  else {
    local_4 = *in_stack_00000018;
  }
  return local_4;
}

Assistant:

int ffibin(fitsfile *fptr,  /* I - FITS file pointer                        */
           LONGLONG naxis2,     /* I - number of rows in the table              */
           int tfields,     /* I - number of columns in the table           */
           char **ttype,    /* I - name of each column                      */
           char **tform,    /* I - value of TFORMn keyword for each column  */
           char **tunit,    /* I - value of TUNITn keyword for each column  */
           const char *extnmx,     /* I - value of EXTNAME keyword, if any         */
           LONGLONG pcount, /* I - size of special data area (heap)         */
           int *status)     /* IO - error status                            */
/*
  insert a Binary table extension following the current HDU 
*/
{
    int nexthdu, maxhdu, ii, nunit, nhead, datacode;
    LONGLONG naxis1;
    long nblocks, repeat, width;
    LONGLONG datasize, newstart;
    char errmsg[FLEN_ERRMSG], extnm[FLEN_VALUE];

    if (*status > 0)
        return(*status);

    extnm[0] = '\0';
    if (extnmx)
      strncat(extnm, extnmx, FLEN_VALUE-1);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    maxhdu = (fptr->Fptr)->maxhdu;
    /* if the current header is completely empty ...  */
    if (( (fptr->Fptr)->headend == (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] )
        /* or, if we are at the end of the file, ... */
    ||  ( (((fptr->Fptr)->curhdu) == maxhdu ) &&
       ((fptr->Fptr)->headstart[maxhdu + 1] >= (fptr->Fptr)->logfilesize ) ) )
    {
        /* then simply append new image extension */
        ffcrtb(fptr, BINARY_TBL, naxis2, tfields, ttype, tform, tunit,
               extnm, status);
        return(*status);
    }

    if (naxis2 < 0)
        return(*status = NEG_ROWS);
    else if (tfields < 0 || tfields > 999)
    {
        snprintf(errmsg, FLEN_ERRMSG,
        "Illegal value for TFIELDS keyword: %d", tfields);
        ffpmsg(errmsg);
        return(*status = BAD_TFIELDS);
    }

    /* count number of optional TUNIT keywords to be written */
    nunit = 0;
    for (ii = 0; ii < tfields; ii++)
    {
        if (tunit && *tunit && *tunit[ii])
            nunit++;
    }

    if (*extnm)
         nunit++;     /* add one for the EXTNAME keyword */

    nhead = (9 + (2 * tfields) + nunit + 35) / 36;  /* no. of header blocks */

    /* calculate total width of the table */
    naxis1 = 0;
    for (ii = 0; ii < tfields; ii++)
    {
        ffbnfm(tform[ii], &datacode, &repeat, &width, status);

        if (datacode == TBIT)
            naxis1 = naxis1 + ((repeat + 7) / 8);
        else if (datacode == TSTRING)
            naxis1 += repeat;
        else
            naxis1 = naxis1 + (repeat * width);
    }

    datasize = ((LONGLONG)naxis1 * naxis2) + pcount;         /* size of table in bytes */
    nblocks = (long) ((datasize + 2879) / 2880) + nhead;  /* size of HDU */

    if ((fptr->Fptr)->writemode == READWRITE) /* must have write access */
    {   /* close the CHDU */
        ffrdef(fptr, status);  /* scan header to redefine structure */
        ffpdfl(fptr, status);  /* insure correct data file values */
    }
    else
        return(*status = READONLY_FILE);

    nexthdu = ((fptr->Fptr)->curhdu) + 1; /* number of the next (new) hdu */
    newstart = (fptr->Fptr)->headstart[nexthdu]; /* save starting addr of HDU */

    (fptr->Fptr)->hdutype = BINARY_TBL;  /* so that correct fill value is used */

    /* ffiblk also increments headstart for all following HDUs */
    if (ffiblk(fptr, nblocks, 1, status) > 0)  /* insert the blocks */
        return(*status);

    ((fptr->Fptr)->maxhdu)++;      /* increment known number of HDUs in the file */
    for (ii = (fptr->Fptr)->maxhdu; ii > (fptr->Fptr)->curhdu; ii--)
        (fptr->Fptr)->headstart[ii + 1] = (fptr->Fptr)->headstart[ii]; /* incre start addr */

    (fptr->Fptr)->headstart[nexthdu] = newstart; /* set starting addr of HDU */

    /* set default parameters for this new empty HDU */
    (fptr->Fptr)->curhdu = nexthdu;   /* we are now located at the next HDU */
    fptr->HDUposition = nexthdu;      /* we are now located at the next HDU */
    (fptr->Fptr)->nextkey = (fptr->Fptr)->headstart[nexthdu];  
    (fptr->Fptr)->headend = (fptr->Fptr)->headstart[nexthdu];
    (fptr->Fptr)->datastart = ((fptr->Fptr)->headstart[nexthdu]) + (nhead * 2880);
    (fptr->Fptr)->hdutype = BINARY_TBL;  /* might need to be reset... */

    /* write the required header keywords. This will write PCOUNT = 0 */
    /* so that the variable length data will be written at the right place */
    ffphbn(fptr, naxis2, tfields, ttype, tform, tunit, extnm, pcount,
           status);

    /* redefine internal structure for this HDU (with PCOUNT = 0) */
    ffrdef(fptr, status);

    return(*status);
}